

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O3

Iff_Man_t *
Gia_ManIffPerform(Gia_Man_t *pGia,If_LibLut_t *pLib,Tim_Man_t *pTime,int nLutSize,int nDegree)

{
  Vec_Flt_t *pVVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  Iff_Man_t *p;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  float (*pafVar12) [33];
  long lVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  int iFanin;
  int iFanin2;
  int iFanin1;
  float local_74;
  int local_60;
  int local_5c;
  ulong local_58;
  Tim_Man_t *local_50;
  float local_48;
  int local_44;
  int local_40;
  int local_3c;
  float (*local_38) [33];
  
  local_50 = pTime;
  if ((nDegree & 0xfffffffeU) != 2) {
    __assert_fail("nDegree == 2 || nDegree == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                  ,0xe9,
                  "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)")
    ;
  }
  p = Gia_ManIffStart(pGia);
  p->pGia = pGia;
  p->pLib = pLib;
  p->nLutSize = nLutSize;
  p->nDegree = nDegree;
  pVVar1 = p->vTimes;
  local_44 = nDegree;
  if (pVVar1->nSize < 1) {
LAB_006fa907:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                  ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
  }
  *pVVar1->pArray = 0.0;
  Tim_ManIncrementTravId(local_50);
  if (pGia->nObjs < 2) {
    dVar16 = -1000000000.0;
    iVar6 = 0;
    iVar5 = 0;
    local_60 = 0;
  }
  else {
    pafVar12 = pLib->pLutDelays;
    local_60 = 0;
    local_74 = -1e+09;
    lVar13 = 1;
    lVar9 = 0xc;
    local_58 = 0;
    iVar6 = 0;
    local_38 = pafVar12;
    do {
      pGVar2 = pGia->pObjs;
      uVar7 = *(ulong *)(&pGVar2->field_0x0 + lVar9);
      uVar11 = (uint)uVar7;
      if ((uVar7 & 0x1fffffff) == 0x1fffffff || (int)uVar11 < 0) {
        pGVar8 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar9);
        uVar10 = (uint)(uVar7 >> 0x20);
        if ((~uVar11 & 0x9fffffff) == 0) {
          if (-1 < (int)uVar11) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          fVar14 = Tim_ManGetCiArrival(local_50,uVar10 & 0x1fffffff);
          pGVar4 = pGia->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar8)) {
LAB_006fa945:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = (int)((long)pGVar2 + (lVar9 - (long)pGVar4) >> 2) * -0x55555555;
          if (((int)uVar11 < 0) || (pVVar1->nSize <= (int)uVar11)) goto LAB_006fa907;
          pVVar1->pArray[uVar11 & 0x7fffffff] = fVar14;
          pafVar12 = local_38;
        }
        else {
          if ((-1 < (int)uVar11) || ((int)(uVar7 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                          ,0x125,
                          "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                         );
          }
          uVar7 = (ulong)-(uVar11 & 0x1fffffff) + lVar13;
          iVar5 = (int)uVar7;
          if ((iVar5 < 0) || (pVVar1->nSize <= iVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar14 = pVVar1->pArray[uVar7 & 0xffffffff];
          Tim_ManSetCoArrival(local_50,uVar10 & 0x1fffffff,fVar14);
          pGVar4 = pGia->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar8)) goto LAB_006fa945;
          uVar11 = (int)((long)pGVar2 + (lVar9 - (long)pGVar4) >> 2) * -0x55555555;
          if (((int)uVar11 < 0) || (pVVar1->nSize <= (int)uVar11)) goto LAB_006fa907;
          pVVar1->pArray[uVar11 & 0x7fffffff] = fVar14;
          pafVar12 = local_38;
          if (local_74 <= fVar14) {
            local_74 = fVar14;
          }
        }
      }
      else {
        if (pGia->vMapping->nSize <= lVar13) goto LAB_006fa926;
        if (pGia->vMapping->pArray[lVar13] != 0) {
          iVar5 = (int)lVar13;
          fVar14 = Gia_IffObjTimeOne(p,iVar5,-1,-1);
          uVar11 = pGia->vMapping->nSize;
          if ((int)uVar11 <= lVar13) {
LAB_006fa926:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar3 = pGia->vMapping->pArray;
          uVar10 = piVar3[lVar13];
          if (((long)(int)uVar10 < 0) || (uVar11 <= uVar10)) goto LAB_006fa926;
          local_60 = local_60 + 1;
          fVar14 = fVar14 + pafVar12[piVar3[(int)uVar10]][0];
          fVar15 = Gia_IffObjTimeTwo(p,iVar5,&local_5c,fVar14);
          if (local_44 == 3) {
            local_48 = fVar15;
            fVar15 = Gia_IffObjTimeThree(p,iVar5,&local_3c,&local_40,fVar15);
            if (pVVar1->nSize <= lVar13) goto LAB_006fa907;
            pVVar1->pArray[lVar13] = fVar15;
            if ((fVar15 != fVar14) || (NAN(fVar15) || NAN(fVar14))) {
              if ((fVar15 == local_48) && (!NAN(fVar15) && !NAN(local_48))) goto LAB_006fa82b;
              if (local_48 <= fVar15) {
                __assert_fail("arrTime3 < arrTime2",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                              ,0x112,
                              "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                             );
              }
              if (p->vMatch[2]->nSize <= lVar13) goto LAB_006fa9c1;
              p->vMatch[2]->pArray[lVar13] = local_3c;
              if (p->vMatch[3]->nSize <= lVar13) goto LAB_006fa9c1;
              p->vMatch[3]->pArray[lVar13] = local_40;
              local_58 = (ulong)((int)local_58 + 1);
            }
          }
          else {
            if (local_44 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                            ,0x117,
                            "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                           );
            }
            if (pVVar1->nSize <= lVar13) goto LAB_006fa907;
            pVVar1->pArray[lVar13] = fVar15;
            if (fVar15 < fVar14) {
LAB_006fa82b:
              if (p->vMatch[2]->nSize <= lVar13) {
LAB_006fa9c1:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p->vMatch[2]->pArray[lVar13] = local_5c;
              iVar6 = iVar6 + 1;
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar13 < pGia->nObjs);
    dVar16 = (double)local_74;
    iVar5 = (int)local_58;
  }
  printf("Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n",dVar16,
         (ulong)(uint)((local_60 - iVar5) - iVar6));
  return p;
}

Assistant:

Iff_Man_t * Gia_ManIffPerform( Gia_Man_t * pGia, If_LibLut_t * pLib, Tim_Man_t * pTime, int nLutSize, int nDegree )
{
    Iff_Man_t * p;
    Gia_Obj_t * pObj;
    int iObj, iFanin, iFanin1, iFanin2;
    int CountAll = 0, Count2 = 0, Count3 = 0;
    float arrTime1, arrTime2, arrTime3, arrMax = -ABC_INFINITY; 
    assert( nDegree == 2 || nDegree == 3 );
    // start the mapping manager and set its parameters
    p = Gia_ManIffStart( pGia );
    p->pGia     = pGia;
    p->pLib     = pLib;
    p->nLutSize = nLutSize;
    p->nDegree  = nDegree;
    // compute arrival times of each node
    Iff_ObjSetTimeId( p, 0, 0 );
    Tim_ManIncrementTravId( pTime );
    Gia_ManForEachObj1( pGia, pObj, iObj )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( !Gia_ObjIsLut(pGia, iObj) )
                continue;
            CountAll++;
            // compute arrival times of LUT inputs
            arrTime1 = Gia_IffObjTimeOne( p, iObj, -1, -1 );
            arrTime1 += p->pLib->pLutDelays[Gia_ObjLutSize(pGia, iObj)][0];
            // compute arrival times of LUT pairs
            arrTime2 = Gia_IffObjTimeTwo( p, iObj, &iFanin, arrTime1 );
            if ( nDegree == 2 )
            {
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime2 );
                if ( arrTime2 < arrTime1 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;                
            }
            else if ( nDegree == 3 )
            {                
                // compute arrival times of LUT triples
                arrTime3 = Gia_IffObjTimeThree( p, iObj, &iFanin1, &iFanin2, arrTime2 );
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime3 );
                if ( arrTime3 == arrTime1 )
                    continue;
                if ( arrTime3 == arrTime2 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;
                else
                {
                    assert( arrTime3 < arrTime2 );
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin1 );
                    Iff_ObjSetMatchId( p, iObj, 3, iFanin2 ), Count3++;
                }
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            arrTime1 = Tim_ManGetCiArrival( pTime, Gia_ObjCioId(pObj) );
            Iff_ObjSetTime( p, pObj, arrTime1 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            arrTime1 = Iff_ObjTimeId( p, Gia_ObjFaninId0p(pGia, pObj) );
            Tim_ManSetCoArrival( pTime, Gia_ObjCioId(pObj), arrTime1 );
            Iff_ObjSetTime( p, pObj, arrTime1 );
            arrMax = Abc_MaxFloat( arrMax, arrTime1 );
        }
        else assert( 0 );
    }
    printf( "Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n", 
        arrMax, CountAll - Count2 - Count3, Count2, Count3 );
    return p;
}